

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,uint64_t *value,uint64_t *defval)

{
  bool bVar1;
  Value *this;
  uint64_t uVar2;
  Value *val;
  uint64_t *defval_local;
  uint64_t *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (defval == (uint64_t *)0x0)) || (*value != *defval)) {
      FSerializer::WriteKey(arc,key);
      FWriter::Uint64(arc->w,*value);
    }
  }
  else {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsUint64(this);
      if (!bVar1) {
        __assert_fail("val->IsUint64()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x4e1,
                      "FSerializer &Serialize(FSerializer &, const char *, uint64_t &, uint64_t *)")
        ;
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsUint64(this);
      if (bVar1) {
        uVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetUint64(this);
        *value = uVar2;
      }
      else {
        Printf("\x1cGinteger type expected for \'%s\'",key);
        arc->mErrors = arc->mErrors + 1;
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, uint64_t &value, uint64_t *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Uint64(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsUint64());
			if (val->IsUint64())
			{
				value = val->GetUint64();
			}
			else
			{
				Printf(TEXTCOLOR_RED "integer type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}